

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  ARKodeSplittingStepMem pAVar1;
  int iVar2;
  int iVar3;
  SplittingStepCoefficients pSVar4;
  ulong uVar5;
  char *func;
  ulong uVar6;
  int error_code;
  char *msgfmt;
  uint order;
  ARKodeSplittingStepMem step_mem;
  
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar2 = splittingStep_AccessStepMem(ark_mem,"splittingStep_Init",&step_mem);
  pAVar1 = step_mem;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (ark_mem->interp_type == 0) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)step_mem->partitions;
    if (step_mem->partitions < 1) {
      uVar6 = 0;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (step_mem->steppers[uVar5]->ops->fullrhs == (SUNStepperFullRhsFn)0x0) {
        func = "splittingStep_Init";
        msgfmt = "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation";
        error_code = -0x16;
        iVar2 = 0x82;
        goto LAB_0015818b;
      }
    }
  }
  error_code = 0;
  if (init_type - 1U < 2) {
    return 0;
  }
  if (ark_mem->fixedstep == 0) {
    func = "splittingStep_Init";
    msgfmt = "Adaptive outer time stepping is not currently supported";
    error_code = -0x16;
    iVar2 = 0x93;
LAB_0015818b:
    arkProcessError(ark_mem,error_code,iVar2,func,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,msgfmt);
  }
  else {
    pSVar4 = step_mem->coefficients;
    if (pSVar4 == (SplittingStepCoefficients)0x0) {
      order = step_mem->order;
      if ((int)order < 2) {
        pSVar4 = SplittingStepCoefficients_LieTrotter(step_mem->partitions);
      }
      else if (order == 3) {
        pSVar4 = SplittingStepCoefficients_ThirdOrderSuzuki(step_mem->partitions);
      }
      else {
        if ((order & 1) != 0) {
          order = order + 1;
          arkProcessError(ark_mem,99,0x5a,"splittingStep_SetCoefficients",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                          ,"No splitting method at requested order, using q=%i.",order);
        }
        pSVar4 = SplittingStepCoefficients_TripleJump(pAVar1->partitions,order);
      }
      pAVar1->coefficients = pSVar4;
      if (pSVar4 == (SplittingStepCoefficients)0x0) {
        func = "splittingStep_SetCoefficients";
        msgfmt = "Failed to allocate splitting coefficients";
        iVar2 = 99;
        error_code = -0x14;
        goto LAB_0015818b;
      }
    }
    iVar2 = pSVar4->order + -1;
    if (ark_mem->interp_degree < pSVar4->order) {
      iVar2 = ark_mem->interp_degree;
    }
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    ark_mem->interp_degree = iVar3;
  }
  return error_code;
}

Assistant:

static int splittingStep_Init(ARKodeMem ark_mem,
                              SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                              int init_type)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (ark_mem->interp_type == ARK_INTERP_HERMITE)
  {
    for (int i = 0; i < step_mem->partitions; i++)
    {
      if (step_mem->steppers[i]->ops->fullrhs == NULL)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation",
                        i);
        return ARK_ILL_INPUT;
      }
    }
  }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return ARK_SUCCESS;
  }

  /* assume fixed step size */
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Adaptive outer time stepping is not currently supported");
    return ARK_ILL_INPUT;
  }

  retval = splittingStep_SetCoefficients(ark_mem, step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  ark_mem->interp_degree =
    SUNMAX(1, SUNMIN(step_mem->coefficients->order - 1, ark_mem->interp_degree));

  return ARK_SUCCESS;
}